

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_gettypetag(HSQUIRRELVM v,SQInteger idx,SQUserPointer *typetag)

{
  HSQOBJECT *o_00;
  SQRESULT SVar1;
  HSQUIRRELVM in_RDX;
  SQObjectPtr *o;
  SQInteger in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  o_00 = &stack_get(in_RDX,in_stack_ffffffffffffffd8)->super_SQObject;
  SVar1 = sq_getobjtypetag(o_00,(SQUserPointer *)in_RDX);
  if (SVar1 < 0) {
    local_8 = -1;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

SQRESULT sq_gettypetag(HSQUIRRELVM v,SQInteger idx,SQUserPointer *typetag)
{
    SQObjectPtr &o = stack_get(v,idx);
    if (SQ_FAILED(sq_getobjtypetag(&o, typetag)))
        return SQ_ERROR;// this is not an error it should be a bool but would break backward compatibility
    return SQ_OK;
}